

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::EmitSwiftDependencyInfo
          (cmNinjaTargetGenerator *this,cmSourceFile *source,string *config)

{
  string *psVar1;
  Value *pVVar2;
  mapped_type *pmVar3;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  undefined1 local_198 [8];
  Value entry;
  string local_160 [32];
  undefined1 local_140 [8];
  string makeDepsPath;
  string local_118 [32];
  undefined1 local_f8 [8];
  string swiftDiaPath;
  string local_d0 [32];
  undefined1 local_b0 [8];
  string swiftDepsPath;
  string local_80;
  undefined1 local_60 [8];
  string objectFilePath;
  string sourceFilePath;
  string *config_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  
  GetCompiledSourceNinjaPath_abi_cxx11_((string *)((long)&objectFilePath.field_2 + 8),this,source);
  GetObjectFilePath(&local_80,this,source,config);
  psVar1 = ConvertToNinjaPath(this,&local_80);
  std::__cxx11::string::string((string *)local_60,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_80);
  swiftDiaPath.field_2._8_8_ = source;
  std::__cxx11::string::string(local_d0,(string *)local_60);
  EmitSwiftDependencyInfo(cmSourceFile_const*,std::__cxx11::string_const&)::$_0::
  operator()[abi_cxx11_((string *)local_b0,(__0 *)(swiftDiaPath.field_2._M_local_buf + 8));
  EmitSwiftDependencyInfo(cmSourceFile_const*,std::__cxx11::string_const&)::$_0::~__0
            ((__0 *)(swiftDiaPath.field_2._M_local_buf + 8));
  makeDepsPath.field_2._8_8_ = source;
  std::__cxx11::string::string(local_118,(string *)local_60);
  EmitSwiftDependencyInfo(cmSourceFile_const*,std::__cxx11::string_const&)::$_1::
  operator()[abi_cxx11_((string *)local_f8,(__1 *)(makeDepsPath.field_2._M_local_buf + 8));
  EmitSwiftDependencyInfo(cmSourceFile_const*,std::__cxx11::string_const&)::$_1::~__1
            ((__1 *)(makeDepsPath.field_2._M_local_buf + 8));
  entry.limit_ = (ptrdiff_t)this;
  std::__cxx11::string::string(local_160,(string *)config);
  EmitSwiftDependencyInfo(cmSourceFile_const*,std::__cxx11::string_const&)::$_2::
  operator()[abi_cxx11_((string *)local_140,(__2 *)&entry.limit_);
  EmitSwiftDependencyInfo(cmSourceFile_const*,std::__cxx11::string_const&)::$_2::~__2
            ((__2 *)&entry.limit_);
  Json::Value::Value((Value *)local_198,objectValue);
  Json::Value::Value(&local_1c0,(String *)local_60);
  pVVar2 = Json::Value::operator[]((Value *)local_198,"object");
  Json::Value::operator=(pVVar2,&local_1c0);
  Json::Value::~Value(&local_1c0);
  Json::Value::Value(&local_1e8,(String *)local_140);
  pVVar2 = Json::Value::operator[]((Value *)local_198,"dependencies");
  Json::Value::operator=(pVVar2,&local_1e8);
  Json::Value::~Value(&local_1e8);
  Json::Value::Value(&local_210,(String *)local_b0);
  pVVar2 = Json::Value::operator[]((Value *)local_198,"swift-dependencies");
  Json::Value::operator=(pVVar2,&local_210);
  Json::Value::~Value(&local_210);
  Json::Value::Value(&local_238,(String *)local_f8);
  pVVar2 = Json::Value::operator[]((Value *)local_198,"diagnostics");
  Json::Value::operator=(pVVar2,&local_238);
  Json::Value::~Value(&local_238);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  pVVar2 = Json::Value::operator[]
                     (&pmVar3->SwiftOutputMap,(String *)((long)&objectFilePath.field_2 + 8));
  Json::Value::operator=(pVVar2,(Value *)local_198);
  Json::Value::~Value((Value *)local_198);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(objectFilePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaTargetGenerator::EmitSwiftDependencyInfo(
  cmSourceFile const* source, const std::string& config)
{
  std::string const sourceFilePath = this->GetCompiledSourceNinjaPath(source);
  std::string const objectFilePath =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
  std::string const swiftDepsPath = [source, objectFilePath]() -> std::string {
    if (cmValue name = source->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return *name;
    }
    return cmStrCat(objectFilePath, ".swiftdeps");
  }();
  std::string const swiftDiaPath = [source, objectFilePath]() -> std::string {
    if (cmValue name = source->GetProperty("Swift_DIAGNOSTICS_FILE")) {
      return *name;
    }
    return cmStrCat(objectFilePath, ".dia");
  }();
  std::string const makeDepsPath = [this, source, config]() -> std::string {
    cmLocalNinjaGenerator const* local = this->GetLocalGenerator();
    std::string const objectFileName =
      this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
    std::string const objectFileDir =
      cmSystemTools::GetFilenamePath(objectFileName);

    if (this->Makefile->IsOn("CMAKE_Swift_DEPFLE_EXTNSION_REPLACE")) {
      std::string dependFileName = cmStrCat(
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName), ".d");
      return local->ConvertToOutputFormat(
        cmStrCat(objectFileDir, '/', dependFileName),
        cmOutputConverter::SHELL);
    }
    return local->ConvertToOutputFormat(cmStrCat(objectFileName, ".d"),
                                        cmOutputConverter::SHELL);
  }();

  // build the source file mapping
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value entry = Json::Value(Json::objectValue);
  entry["object"] = objectFilePath;
  entry["dependencies"] = makeDepsPath;
  entry["swift-dependencies"] = swiftDepsPath;
  entry["diagnostics"] = swiftDiaPath;
  this->Configs[config].SwiftOutputMap[sourceFilePath] = entry;
}